

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

size_t __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::bucket_count(parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *this)

{
  long lVar1;
  size_t sVar2;
  SharedLock m;
  WriteLock local_30;
  
  sVar2 = 0;
  for (lVar1 = 0; lVar1 != 0x700; lVar1 = lVar1 + 0x70) {
    local_30.m_ = (mutex_type *)
                  ((long)&(this->sets_)._M_elems[0].super_Lockable.super_mutex.super___mutex_base.
                          _M_mutex + lVar1);
    std::mutex::lock(local_30.m_);
    local_30.locked_ = true;
    sVar2 = sVar2 + *(long *)((long)&(this->sets_)._M_elems[0].set_.capacity_ + lVar1);
    LockableBaseImpl<std::mutex>::WriteLock::~WriteLock(&local_30);
  }
  return sVar2;
}

Assistant:

size_t bucket_count() const {
        size_t sz = 0;
        for (const auto& inner : sets_)
        {
            SharedLock m(const_cast<Inner&>(inner));
            sz += inner.set_.bucket_count();
        }
        return sz; 
    }